

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogL16Decode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  int iVar4;
  undefined6 in_register_0000000a;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint8_t *p;
  ulong uVar12;
  bool bVar13;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0xc5,"int LogL16Decode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0xc6,"int LogL16Decode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar2 + 0xc);
  p = op;
  if (*(int *)(puVar2 + 4) != 1) {
    if (*(long *)(puVar2 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogL16Decode","Translation buffer too short");
      return 0;
    }
    p = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(p,0,lVar3 * 2);
  pbVar8 = tif->tif_rawcp;
  uVar12 = tif->tif_rawcc;
  iVar4 = 8;
  while ((lVar3 < 1 || ((long)uVar12 < 1))) {
    lVar10 = 0;
LAB_002a76e7:
    if (lVar3 != lVar10) {
      TIFFErrorExtR(tif,"LogL16Decode","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row);
      tif->tif_rawcp = pbVar8;
      tif->tif_rawcc = uVar12;
      return 0;
    }
    bVar13 = iVar4 == 0;
    iVar4 = iVar4 + -8;
    if (bVar13) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar3);
      tif->tif_rawcp = pbVar8;
      tif->tif_rawcc = uVar12;
      return 1;
    }
  }
  lVar10 = 0;
  pbVar7 = pbVar8;
  do {
    uVar5 = (uint)*pbVar7;
    if ((char)*pbVar7 < '\0') {
      pbVar8 = pbVar7;
      if (uVar12 < 2) goto LAB_002a76e7;
      pbVar8 = pbVar7 + 2;
      uVar12 = uVar12 - 2;
      if ((uVar5 != 0x7e) && (lVar10 < lVar3)) {
        bVar1 = pbVar7[1];
        iVar6 = uVar5 - 0x7f;
        do {
          *(ushort *)(p + lVar10 * 2) =
               *(ushort *)(p + lVar10 * 2) | (ushort)bVar1 << ((byte)iVar4 & 0x1f);
          lVar10 = lVar10 + 1;
          bVar13 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar13) break;
        } while (lVar10 < lVar3);
      }
    }
    else {
      if (uVar12 == 1) {
        pbVar8 = pbVar7 + 1;
LAB_002a76e4:
        uVar12 = 0;
        goto LAB_002a76e7;
      }
      uVar11 = 1;
      while ((lVar9 = lVar10 + uVar11 + -1, (int)uVar11 - uVar5 != 1 && (lVar9 < lVar3))) {
        *(ushort *)(p + uVar11 * 2 + lVar10 * 2 + -2) =
             *(ushort *)(p + uVar11 * 2 + lVar10 * 2 + -2) |
             (ushort)pbVar7[uVar11] << ((byte)iVar4 & 0x1f);
        uVar11 = uVar11 + 1;
        if (uVar12 == uVar11) {
          pbVar8 = pbVar7 + uVar11;
          lVar10 = lVar10 + uVar11 + -1;
          goto LAB_002a76e4;
        }
      }
      uVar12 = uVar12 - uVar11;
      pbVar8 = pbVar7 + uVar11;
      lVar10 = lVar9;
    }
    if ((lVar3 <= lVar10) || (pbVar7 = pbVar8, (long)uVar12 < 1)) goto LAB_002a76e7;
  } while( true );
}

Assistant:

static int LogL16Decode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogL16Decode";
    LogLuvState *sp = DecoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    int16_t *tp;
    int16_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (int16_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (int16_t)(*bp++ << shft);
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (int16_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}